

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

U32 ZSTD_rawLiteralsCost(BYTE *literals,U32 litLength,optState_t *optPtr)

{
  int iVar1;
  U32 UVar2;
  U32 UVar3;
  uint uVar4;
  ulong uVar5;
  
  if (litLength == 0) {
    UVar3 = 0;
  }
  else if (optPtr->priceType == zop_predef) {
    UVar3 = litLength * 6;
  }
  else if (optPtr->priceType == zop_static) {
    UVar3 = 0;
    for (uVar5 = 0; litLength != uVar5; uVar5 = uVar5 + 1) {
      UVar2 = HUF_getNbBits(optPtr->symbolCosts,(uint)literals[uVar5]);
      UVar3 = UVar3 + UVar2;
    }
  }
  else {
    UVar3 = litLength * optPtr->log2litSum;
    for (uVar5 = 0; litLength != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = optPtr->litFreq[literals[uVar5]] + 1;
      iVar1 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> iVar1 == 0; iVar1 = iVar1 + -1) {
        }
      }
      UVar3 = UVar3 - iVar1;
    }
  }
  return UVar3;
}

Assistant:

static U32 ZSTD_rawLiteralsCost(const BYTE* const literals, U32 const litLength,
                                const optState_t* const optPtr)
{
    if (litLength == 0) return 0;
    if (optPtr->priceType == zop_predef) return (litLength*6);  /* 6 bit per literal - no statistic used */
    if (optPtr->priceType == zop_static) {
        U32 u, cost;
        assert(optPtr->symbolCosts != NULL);
        assert(optPtr->symbolCosts->hufCTable_repeatMode == HUF_repeat_valid);
        for (u=0, cost=0; u < litLength; u++)
            cost += HUF_getNbBits(optPtr->symbolCosts->hufCTable, literals[u]);
        return cost * BITCOST_MULTIPLIER;
    }

    /* dynamic statistics */
    {   U32 u;
        U32 cost = litLength * optPtr->log2litSum;
        for (u=0; u < litLength; u++)
            cost -= ZSTD_highbit32(optPtr->litFreq[literals[u]]+1);
        return cost * BITCOST_MULTIPLIER;
    }
}